

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keeper_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
           *this,undefined8 *state,long *next)

{
  undefined8 uVar1;
  size_t count;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char cVar9;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptr;
  long lVar10;
  long lVar11;
  node_base *pnVar12;
  long lVar13;
  long lVar14;
  node_base *out;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  uVar1 = *state;
  count = state[2];
  lVar11 = state[0xb];
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = (char *)state[3];
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .matched = false;
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._20_4_ = 0;
  local_58.begin_._M_current = (char *)state[3];
  local_58.zero_width_ = false;
  ptr = *(sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          **)(lVar11 + 0x18);
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current =
       local_58.
       super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .first._M_current;
  if ((ulong)((*(long *)(lVar11 + 0x20) - (long)ptr >> 3) * -0x3333333333333333) < count) {
    ptr = sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::grow_((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(lVar11 + 8),count,&local_58);
  }
  else {
    *(sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      **)(lVar11 + 0x18) = ptr + count;
  }
  lVar14 = 0;
  for (lVar11 = *(long *)(state[7] + 0x70); lVar11 != state[7] + 0x68;
      lVar11 = *(long *)(lVar11 + 8)) {
    lVar14 = lVar14 + 1;
  }
  uVar2 = state[0xd];
  puVar3 = (undefined8 *)state[0xe];
  uVar7 = state[0x10];
  uVar5 = state[0x10];
  uVar8 = state[0x11];
  uVar6 = state[0x11];
  state[0xd] = 0;
  state[0xe] = state + 0xd;
  if (0 < (long)state[2]) {
    lVar11 = state[1];
    lVar10 = state[2] + 1;
    lVar13 = 0;
    do {
      *(undefined8 *)
       ((long)&(ptr->
               super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .first._M_current + lVar13) = *(undefined8 *)(lVar11 + lVar13);
      *(undefined8 *)
       ((long)&(ptr->
               super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .second._M_current + lVar13) = *(undefined8 *)(lVar11 + 8 + lVar13);
      (&(ptr->
        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).matched)[lVar13] = *(bool *)(lVar11 + 0x10 + lVar13);
      uVar4 = *(undefined8 *)(lVar11 + 0x19 + lVar13);
      *(undefined8 *)
       (&(ptr->
         super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).field_0x14 + lVar13) = *(undefined8 *)(lVar11 + 0x14 + lVar13);
      *(undefined8 *)((long)&(ptr->begin_)._M_current + lVar13 + 1) = uVar4;
      lVar10 = lVar10 + -1;
      lVar13 = lVar13 + 0x28;
    } while (1 < lVar10);
  }
  cVar9 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
  state[0xd] = uVar2;
  state[0xe] = puVar3;
  *puVar3 = 0;
  if (cVar9 == '\0') {
    lVar10 = 0;
    for (lVar11 = *(long *)(state[7] + 0x70); lVar11 != state[7] + 0x68;
        lVar11 = *(long *)(lVar11 + 8)) {
      lVar10 = lVar10 + 1;
    }
    if (lVar10 == lVar14) {
      sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(state[0xb] + 8),ptr);
    }
    state[0x10] = uVar7;
    state[0x11] = uVar8;
  }
  else {
    cVar9 = (**(code **)(*next + 0x10))(next,state);
    pnVar12 = *(node_base **)(state[7] + 0x70);
    out = (node_base *)(state[7] + 0x68);
    if (cVar9 != '\0') {
      lVar11 = 0;
      for (; pnVar12 != out; pnVar12 = pnVar12->_next) {
        lVar11 = lVar11 + 1;
      }
      if (lVar11 != lVar14) {
        return true;
      }
      sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(state[0xb] + 8),ptr);
      return true;
    }
    lVar11 = 0;
    for (; pnVar12 != out; pnVar12 = pnVar12->_next) {
      lVar11 = lVar11 + 1;
    }
    if (lVar11 != lVar14) {
      lVar10 = state[0xb];
      lVar14 = lVar14 - lVar11;
      do {
        results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reclaim_last((results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(lVar10 + 0x28),
                       (nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)out);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0);
    }
    if (0 < (long)state[2]) {
      lVar11 = state[1];
      lVar14 = state[2] + 1;
      lVar10 = 0;
      do {
        *(undefined8 *)(lVar11 + lVar10) =
             *(undefined8 *)
              ((long)&(ptr->
                      super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).
                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .first._M_current + lVar10);
        *(undefined8 *)(lVar11 + 8 + lVar10) =
             *(undefined8 *)
              ((long)&(ptr->
                      super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).
                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .second._M_current + lVar10);
        *(bool *)(lVar11 + 0x10 + lVar10) =
             (&(ptr->
               super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).matched)[lVar10];
        uVar2 = *(undefined8 *)((long)&(ptr->begin_)._M_current + lVar10 + 1);
        *(undefined8 *)(lVar11 + 0x14 + lVar10) =
             *(undefined8 *)
              (&(ptr->
                super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).field_0x14 + lVar10);
        *(undefined8 *)(lVar11 + 0x19 + lVar10) = uVar2;
        lVar14 = lVar14 + -1;
        lVar10 = lVar10 + 0x28;
      } while (1 < lVar14);
    }
    sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(state[0xb] + 8),ptr);
    state[0x10] = uVar5;
    state[0x11] = uVar6;
    *state = uVar1;
  }
  return false;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::false_) const
        {
            BidiIter const tmp = state.cur_;

            // matching xpr could produce side-effects, save state
            memento<BidiIter> mem = save_sub_matches(state);

            if(!this->xpr_.match(state))
            {
                restore_action_queue(mem, state);
                reclaim_sub_matches(mem, state, false);
                return false;
            }
            restore_action_queue(mem, state);
            if(next.match(state))
            {
                reclaim_sub_matches(mem, state, true);
                return true;
            }

            restore_sub_matches(mem, state);
            state.cur_ = tmp;
            return false;
        }